

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Promise<bool> __thiscall kj::HttpServer::Connection::startLoop(Connection *this)

{
  bool bVar1;
  byte extraout_AL;
  undefined8 *puVar2;
  Coroutine<bool> *this_00;
  Promise<kj::HttpServer::Connection::LoopResult> *promise;
  LoopResult *value;
  PromiseAwaiter<kj::HttpServer::Connection::LoopResult> *__return_storage_ptr__;
  Connection *this_01;
  undefined8 in_RSI;
  void *pvVar3;
  void *in_stack_fffffffffffffa80;
  Fault local_480;
  Fault f;
  LoopResult *local_470;
  undefined1 local_468 [8];
  DebugComparison<kj::HttpServer::Connection::LoopResult_&,_kj::HttpServer::Connection::LoopResult>
  _kjCondition;
  Connection *this_local;
  
  puVar2 = (undefined8 *)operator_new(0x430);
  *puVar2 = startLoop;
  puVar2[1] = startLoop;
  value = (LoopResult *)((long)puVar2 + 0x424);
  __return_storage_ptr__ = (PromiseAwaiter<kj::HttpServer::Connection::LoopResult> *)(puVar2 + 0x47)
  ;
  this_01 = (Connection *)(puVar2 + 0x82);
  this_00 = (Coroutine<bool> *)(puVar2 + 2);
  puVar2[0x83] = in_RSI;
  SourceLocation::SourceLocation
            ((SourceLocation *)(puVar2 + 0x7e),
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
             ,"startLoop",0x1cea,0x15);
  pvVar3 = (void *)puVar2[0x80];
  kj::_::Coroutine<bool>::Coroutine(this_00,*(SourceLocation *)(puVar2 + 0x7e));
  kj::_::Coroutine<bool>::get_return_object((Coroutine<bool> *)this);
  kj::_::CoroutineBase::initial_suspend((CoroutineBase *)this_00);
  bVar1 = std::__n4861::suspend_never::await_ready((suspend_never *)((long)puVar2 + 0x429));
  if (bVar1) {
    std::__n4861::suspend_never::await_resume((suspend_never *)((long)puVar2 + 0x429));
    startLoopImpl(this_01);
    promise = kj::_::Coroutine<bool>::
              await_transform<kj::Promise<kj::HttpServer::Connection::LoopResult>>
                        (this_00,(Promise<kj::HttpServer::Connection::LoopResult> *)this_01);
    co_await<kj::HttpServer::Connection::LoopResult>(__return_storage_ptr__,promise);
    bVar1 = kj::_::PromiseAwaiterBase::await_ready((PromiseAwaiterBase *)__return_storage_ptr__);
    if (!bVar1) {
      *(undefined1 *)(puVar2 + 0x85) = 1;
      startLoop(in_stack_fffffffffffffa80,pvVar3);
      if ((extraout_AL & 1) != 0) {
        return (PromiseBase)(PromiseBase)this;
      }
    }
    _kjCondition._36_4_ =
         kj::_::PromiseAwaiter<kj::HttpServer::Connection::LoopResult>::await_resume
                   (__return_storage_ptr__);
    kj::_::PromiseAwaiter<kj::HttpServer::Connection::LoopResult>::~PromiseAwaiter
              (__return_storage_ptr__);
    Promise<kj::HttpServer::Connection::LoopResult>::~Promise
              ((Promise<kj::HttpServer::Connection::LoopResult> *)this_01);
    *value = _kjCondition._36_4_;
    local_470 = (LoopResult *)
                kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,value);
    f.exception._4_4_ = 0;
    kj::_::DebugExpression<kj::HttpServer::Connection::LoopResult&>::operator!=
              ((DebugComparison<kj::HttpServer::Connection::LoopResult_&,_kj::HttpServer::Connection::LoopResult>
                *)local_468,(DebugExpression<kj::HttpServer::Connection::LoopResult&> *)&local_470,
               (LoopResult *)((long)&f.exception + 4));
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_468);
    if (!bVar1) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<kj::HttpServer::Connection::LoopResult&,kj::HttpServer::Connection::LoopResult>&>
                (&local_480,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                 ,0x1cec,FAILED,"result != CONTINUE_LOOP","_kjCondition,",
                 (DebugComparison<kj::HttpServer::Connection::LoopResult_&,_kj::HttpServer::Connection::LoopResult>
                  *)local_468);
      kj::_::Debug::Fault::fatal(&local_480);
    }
    kj::_::CoroutineMixin<kj::_::Coroutine<bool>,_bool>::return_value
              ((CoroutineMixin<kj::_::Coroutine<bool>,_bool> *)this_00,*value == BREAK_LOOP_CONN_OK)
    ;
    kj::_::CoroutineBase::final_suspend((CoroutineBase *)this_00);
    bVar1 = std::__n4861::suspend_always::await_ready((suspend_always *)((long)puVar2 + 0x42a));
    if (bVar1) {
      std::__n4861::suspend_always::await_resume((suspend_always *)((long)puVar2 + 0x42a));
      kj::_::Coroutine<bool>::~Coroutine(this_00);
      if (puVar2 != (undefined8 *)0x0) {
        operator_delete(puVar2,0x430);
      }
    }
    else {
      *puVar2 = 0;
      *(undefined1 *)(puVar2 + 0x85) = 2;
      startLoop(in_stack_fffffffffffffa80,pvVar3);
    }
  }
  else {
    *(undefined1 *)(puVar2 + 0x85) = 0;
    startLoop(in_stack_fffffffffffffa80,pvVar3);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<bool> startLoop() {
    auto result = co_await startLoopImpl();
    KJ_ASSERT(result != CONTINUE_LOOP);
    co_return result == BREAK_LOOP_CONN_OK ? true : false;
  }